

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *pFVar3;
  double *pdVar4;
  value_type vVar5;
  double dVar6;
  
  vVar5 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).right_;
  dVar6 = (double)(this->right_->fadexpr_).left_.constant_ + pFVar1->val_;
  pdVar4 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar4 = (pFVar1->dx_).ptr_to_data + i;
  }
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  return (vVar5 * dVar6 -
         (((double)(pFVar3->fadexpr_).left_.constant_ - ((pFVar3->fadexpr_).right_)->val_) +
         ((pFVar2->fadexpr_).right_)->val_) * ((this->left_->fadexpr_).left_)->val_ * *pdVar4) /
         (dVar6 * dVar6);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}